

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

int __thiscall
ON_PolyCurve::SegmentIndex
          (ON_PolyCurve *this,ON_Interval sub_domain,int *segment_index0,int *segment_index1)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int segment_index;
  double *pdVar4;
  double dVar5;
  double dVar6;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  dVar5 = sub_domain.m_t[1];
  local_50.m_t[0] = sub_domain.m_t[0];
  iVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_50.m_t[1] = dVar5;
  ON_Interval::ON_Interval(&local_60);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  local_40.m_t[1] = dVar5;
  ON_Interval::Intersection(&local_50,&local_40);
  bVar2 = ON_Interval::IsIncreasing(&local_50);
  segment_index = 0;
  iVar3 = 0;
  if (bVar2) {
    dVar5 = ON_Interval::Min(&local_50);
    iVar3 = SegmentIndex(this,dVar5);
    segment_index = iVar3;
    do {
      segment_index = segment_index + 1;
      if (iVar1 <= segment_index) break;
      local_60 = SegmentDomain(this,segment_index);
      pdVar4 = ON_Interval::operator[](&local_60,0);
      dVar5 = *pdVar4;
      dVar6 = ON_Interval::Max(&local_50);
    } while (dVar5 < dVar6);
  }
  if (segment_index0 != (int *)0x0) {
    *segment_index0 = iVar3;
  }
  if (segment_index1 != (int *)0x0) {
    *segment_index1 = segment_index;
  }
  return segment_index - iVar3;
}

Assistant:

int ON_PolyCurve::SegmentIndex(
  ON_Interval sub_domain,
  int* segment_index0,
  int* segment_index1
  ) const
{
  const int segment_count = m_segment.Count();
  int s0 = 0, s1 = 0;
  ON_Interval seg_dom;
  sub_domain.Intersection( Domain() );
  if ( sub_domain.IsIncreasing() )
  {
    s0 = SegmentIndex(sub_domain.Min());
    for ( s1 = s0+1; s1 < segment_count; s1++ )
    {
      seg_dom = SegmentDomain(s1);
      if ( seg_dom[0] >= sub_domain.Max() )
        break;
    }
  }
  if ( segment_index0 )
    *segment_index0 = s0;
  if ( segment_index1 )
    *segment_index1 = s1;
  return s1-s0;
}